

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_dec.cc
# Opt level: O3

int asn1_check_tlen(long *olen,int *otag,uchar *oclass,char *cst,uchar **in,long len,int exptag,
                   int expclass,char opt)

{
  int iVar1;
  int line;
  int ptag;
  int local_40;
  int local_3c;
  uchar *local_38;
  long local_30;
  
  local_38 = *in;
  iVar1 = ASN1_get_object(&local_38,&local_30,&local_3c,&local_40,len);
  if ((char)(byte)iVar1 < '\0') {
    iVar1 = 0x67;
    line = 0x3a3;
  }
  else {
    if ((exptag < 0) || ((local_3c == exptag && (local_40 == expclass)))) {
      if (cst != (char *)0x0) {
        *cst = (byte)iVar1 & 0x20;
      }
      if (olen != (long *)0x0) {
        *olen = local_30;
      }
      if (oclass != (uchar *)0x0) {
        *oclass = (uchar)local_40;
      }
      if (otag != (int *)0x0) {
        *otag = local_3c;
      }
      *in = local_38;
      return 1;
    }
    if (opt != '\0') {
      return -1;
    }
    iVar1 = 0xbe;
    line = 0x3ac;
  }
  ERR_put_error(0xc,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                ,line);
  return 0;
}

Assistant:

static int asn1_check_tlen(long *olen, int *otag, unsigned char *oclass,
                           char *cst, const unsigned char **in, long len,
                           int exptag, int expclass, char opt) {
  int i;
  int ptag, pclass;
  long plen;
  const unsigned char *p;
  p = *in;

  i = ASN1_get_object(&p, &plen, &ptag, &pclass, len);
  if (i & 0x80) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_BAD_OBJECT_HEADER);
    return 0;
  }
  if (exptag >= 0) {
    if ((exptag != ptag) || (expclass != pclass)) {
      // If type is OPTIONAL, not an error: indicate missing type.
      if (opt) {
        return -1;
      }
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_WRONG_TAG);
      return 0;
    }
  }

  if (cst) {
    *cst = i & V_ASN1_CONSTRUCTED;
  }

  if (olen) {
    *olen = plen;
  }

  if (oclass) {
    *oclass = pclass;
  }

  if (otag) {
    *otag = ptag;
  }

  *in = p;
  return 1;
}